

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O1

void __thiscall RtMidiError::printMessage(RtMidiError *this)

{
  ostream *poVar1;
  char local_9;
  
  local_9 = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_9,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->message_)._M_dataplus._M_p,(this->message_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  return;
}

Assistant:

virtual void printMessage( void ) const throw() { std::cerr << '\n' << message_ << "\n\n"; }